

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestStringToDoubleFloatWhitespace(void)

{
  int kWhitespace16Length;
  uc16 kWhitespace16 [76];
  uc16 kIdeographicSpace;
  uc16 kMediumMathematicalSpace;
  uc16 kNarrowNoBreakSpace;
  uc16 kHairSpace;
  uc16 kThinSpace;
  uc16 kPunctuationSpace;
  uc16 kFigureSpace;
  uc16 kSixPerEmSpace;
  uc16 kFourPerEmSpace;
  uc16 kThreePerEmSpace;
  uc16 kEmSpace;
  uc16 kEnSpace;
  uc16 kEmQuad;
  uc16 kEnQuad;
  uc16 kMongolianVowelSeparator;
  uc16 kOghamSpaceMark;
  char kWhitespaceAscii [23];
  bool all_used;
  int processed;
  int flags;
  uc16 in_stack_0000013e;
  bool *in_stack_00000140;
  int *in_stack_00000148;
  double in_stack_00000150;
  int in_stack_0000015c;
  char *in_stack_00000160;
  undefined8 *value;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar1;
  double in_stack_fffffffffffffee8;
  undefined8 *expected;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar2;
  undefined8 in_stack_fffffffffffffef8;
  int iVar3;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar4;
  undefined1 local_e8 [6];
  uc16 in_stack_ffffffffffffff1e;
  bool *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  double in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  uc16 *in_stack_ffffffffffffff40;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined2 local_14;
  undefined1 local_12;
  undefined4 local_4;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_4 = 0x38;
  local_28 = 0xa2d200c0b090d0a;
  local_20 = 0x322e31200c0b090d;
  local_18 = 0xb090d0a;
  local_14 = 0x200c;
  local_12 = 0;
  value = &local_28;
  uVar1 = 0x38;
  double_conversion::Double::NaN();
  StrToD(in_stack_00000160,in_stack_0000015c,in_stack_00000150,in_stack_00000148,in_stack_00000140,
         in_stack_0000013e);
  CheckEqualsHelper((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),iVar3,
                    (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    in_stack_fffffffffffffee8,(char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),
                    (double)value);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
              (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
              (char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),SUB81((ulong)value >> 0x38,0));
  expected = &local_28;
  uVar2 = local_4;
  double_conversion::Double::NaN();
  StrToF(in_stack_00000160,in_stack_0000015c,in_stack_00000150,in_stack_00000148,in_stack_00000140);
  CheckEqualsHelper((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),iVar3,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffef0),(double)expected,
                    (char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),(double)value);
  CheckHelper((char *)CONCAT44(uVar2,in_stack_fffffffffffffef0),(int)((ulong)expected >> 0x20),
              (char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),SUB81((ulong)value >> 0x38,0));
  memcpy(local_e8,&DAT_00c4c950,0x98);
  iVar3 = (int)((ulong)local_e8 >> 0x20);
  uVar4 = local_4;
  double_conversion::Double::NaN();
  StrToD16(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
           in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
           in_stack_ffffffffffffff1e);
  CheckEqualsHelper((char *)CONCAT44(uVar4,in_stack_ffffffffffffff00),iVar3,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffef0),(double)expected,
                    (char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),(double)value);
  CheckHelper((char *)CONCAT44(uVar2,in_stack_fffffffffffffef0),(int)((ulong)expected >> 0x20),
              (char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),SUB81((ulong)value >> 0x38,0));
  double_conversion::Single::NaN();
  StrToF16(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
           in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  CheckEqualsHelper((char *)CONCAT44(uVar4,in_stack_ffffffffffffff00),iVar3,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffef0),(double)expected,
                    (char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),(double)value);
  CheckHelper((char *)CONCAT44(uVar2,in_stack_fffffffffffffef0),(int)((ulong)expected >> 0x20),
              (char *)CONCAT44(uVar1,in_stack_fffffffffffffee0),SUB81((ulong)value >> 0x38,0));
  return;
}

Assistant:

TEST(StringToDoubleFloatWhitespace) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;

  const char kWhitespaceAscii[] = {
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    '-',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    '1', '.', '2',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    0x00
  };
  CHECK_EQ(-1.2, StrToD(kWhitespaceAscii, flags, Double::NaN(),
                        &processed, &all_used));
  CHECK(all_used);
  CHECK_EQ(-1.2f, StrToF(kWhitespaceAscii, flags, Double::NaN(),
                         &processed, &all_used));
  CHECK(all_used);

  const uc16 kOghamSpaceMark = 0x1680;
  const uc16 kMongolianVowelSeparator = 0x180E;
  const uc16 kEnQuad = 0x2000;
  const uc16 kEmQuad = 0x2001;
  const uc16 kEnSpace = 0x2002;
  const uc16 kEmSpace = 0x2003;
  const uc16 kThreePerEmSpace = 0x2004;
  const uc16 kFourPerEmSpace = 0x2005;
  const uc16 kSixPerEmSpace = 0x2006;
  const uc16 kFigureSpace = 0x2007;
  const uc16 kPunctuationSpace = 0x2008;
  const uc16 kThinSpace = 0x2009;
  const uc16 kHairSpace = 0x200A;
  const uc16 kNarrowNoBreakSpace = 0x202F;
  const uc16 kMediumMathematicalSpace = 0x205F;
  const uc16 kIdeographicSpace = 0x3000;

  const uc16 kWhitespace16[] = {
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
    '-',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
    '1', '.', '2',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
  };
  const int kWhitespace16Length = DOUBLE_CONVERSION_ARRAY_SIZE(kWhitespace16);
  CHECK_EQ(-1.2, StrToD16(kWhitespace16, kWhitespace16Length, flags,
                          Double::NaN(),
                          &processed, &all_used));
  CHECK(all_used);
  CHECK_EQ(-1.2f, StrToF16(kWhitespace16, kWhitespace16Length, flags,
                           Single::NaN(),
                           &processed, &all_used));
  CHECK(all_used);
}